

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O1

_Bool player_get_recall_point(player *p)

{
  wchar_t wVar1;
  ulong uVar2;
  _Bool _Var3;
  bool bVar4;
  
  _Var3 = false;
  do {
    wVar1 = get_quantity("Which level do you wish to return to (0 to cancel)? ",(int)p->max_depth);
    bVar4 = _Var3;
    if (wVar1 != L'\0') {
      if ((ulong)chunk_list_max != 0) {
        uVar2 = 0;
        do {
          if (chunk_list[uVar2]->depth == wVar1) {
            bVar4 = true;
            break;
          }
          uVar2 = uVar2 + 1;
        } while (chunk_list_max != uVar2);
      }
      if (!bVar4) {
        msg("You must choose a level you have previously visited.");
      }
    }
    if (wVar1 == L'\0') {
      return _Var3;
    }
    _Var3 = bVar4;
    if (bVar4 != false) {
      p->recall_pt = (int16_t)wVar1;
      return bVar4;
    }
  } while( true );
}

Assistant:

bool player_get_recall_point(struct player *p)
{
	bool level_ok = false;
	int new = 0;

	while (!level_ok) {
		const char *prompt =
			"Which level do you wish to return to (0 to cancel)? ";
		int i;

		/* Choose the level */
		new = get_quantity(prompt, p->max_depth);
		if (new == 0) {
			return false;
		}

		/* Is that level valid? */
		for (i = 0; i < chunk_list_max; i++) {
			if (chunk_list[i]->depth == new) {
				level_ok = true;
				break;
			}
		}
		if (!level_ok) {
			msg("You must choose a level you have previously visited.");
		}
	}
	p->recall_pt = new;
	return true;
}